

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void Bpputrast(char *fn,float *bf,int sx,int sy,int r)

{
  uint __fd;
  ssize_t sVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  float __x;
  uchar c;
  undefined1 local_45;
  uint local_44;
  ulong local_40;
  long local_38;
  
  uVar3 = 0x180;
  local_44 = sx;
  __fd = creat(fn,0x180);
  if ((int)__fd < 1) {
LAB_00102d3e:
    Bpputrast_cold_1();
    __x = 0.0;
    if (0 < (int)uVar3) {
      uVar2 = 0;
      do {
        __x = __x + *(float *)(fn + uVar2 * 4) * *(float *)(fn + uVar2 * 4);
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    if (0.0 <= __x) {
      return;
    }
    sqrtf(__x);
    return;
  }
  if (0 < sy) {
    local_40 = (ulong)(uint)sy;
    uVar2 = (ulong)local_44;
    local_38 = (long)r << 2;
    uVar6 = 0;
    do {
      if (0 < (int)local_44) {
        uVar5 = 0;
        do {
          local_45 = (undefined1)(int)bf[uVar5];
          fn = (char *)(ulong)__fd;
          puVar4 = &local_45;
          sVar1 = write(__fd,&local_45,1);
          uVar3 = (uint)puVar4;
          if (sVar1 != 1) {
            Bpputrast_cold_2();
            goto LAB_00102d3e;
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      uVar6 = uVar6 + 1;
      bf = (float *)((long)bf + local_38);
    } while (uVar6 != local_40);
  }
  close(__fd);
  return;
}

Assistant:

void Bpputrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        c = (unsigned char)bf[r*i + j] ;
        if (write(fd,&c,sizeof(c)) != 1) {
          error(7) ;
        }
      }
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}